

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_accepted(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *handle;
  uv_tcp_t *handle_00;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_48;
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  uv__queue *puStack_20;
  uv_loop_t *local_18;
  uv_loop_t *local_10;
  
  handle = (uv_tcp_t *)&stack0xffffffffffffffe8;
  puStack_20 = (uv__queue *)0x1c5745;
  loop = uv_default_loop();
  puStack_20 = (uv__queue *)0x1c5754;
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 0;
  puStack_20 = (uv__queue *)0x1c5771;
  do_connect(loop,in_RSI);
  local_10 = (uv_loop_t *)(long)write_cb_called;
  local_18 = (uv_loop_t *)0x0;
  if (local_10 == (uv_loop_t *)0x0) {
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c58d1;
    local_10 = (uv_loop_t *)(long)shutdown_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c58de;
    puStack_20 = (uv__queue *)0x1c57e8;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    puVar1 = loop;
    local_10 = (uv_loop_t *)(long)iVar2;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c58eb;
    local_10 = (uv_loop_t *)0x4;
    local_18 = (uv_loop_t *)(long)write_cb_called;
    if (local_18 != (uv_loop_t *)0x4) goto LAB_001c58f8;
    local_10 = (uv_loop_t *)0x1;
    local_18 = (uv_loop_t *)(long)close_cb_called;
    if (local_18 != (uv_loop_t *)0x1) goto LAB_001c5905;
    local_10 = (uv_loop_t *)(long)shutdown_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c5912;
    puStack_20 = (uv__queue *)0x1c5887;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv__queue *)0x1c5891;
    uv_run(puVar1,UV_RUN_DEFAULT);
    local_10 = (uv_loop_t *)0x0;
    puStack_20 = (uv__queue *)0x1c58a6;
    iVar2 = uv_loop_close(loop);
    local_18 = (uv_loop_t *)(long)iVar2;
    unaff_RBX = puVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv__queue *)0x1c58bc;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv__queue *)0x1c58d1;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c58d1:
    puStack_20 = (uv__queue *)0x1c58de;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c58de:
    puStack_20 = (uv__queue *)0x1c58eb;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c58eb:
    puStack_20 = (uv__queue *)0x1c58f8;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c58f8:
    puStack_20 = (uv__queue *)0x1c5905;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c5905:
    puStack_20 = (uv__queue *)0x1c5912;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c5912:
    puStack_20 = (uv__queue *)0x1c591f;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  puStack_20 = (uv__queue *)run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  handle_00 = (uv_tcp_t *)auStack_30;
  auStack_40._8_8_ = (uv_loop_t *)0x1c5936;
  puStack_20 = (uv__queue *)unaff_RBX;
  loop = uv_default_loop();
  auStack_40._8_8_ = (uv_loop_t *)0x1c5945;
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  auStack_40._8_8_ = (uv_loop_t *)0x1c5962;
  do_connect(loop,handle);
  auStack_30._8_8_ = SEXT48(write_cb_called);
  auStack_30._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_30._8_8_ == (uv_loop_t *)0x0) {
    auStack_30._8_8_ = SEXT48(close_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5ac2;
    auStack_30._8_8_ = SEXT48(shutdown_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5acf;
    auStack_40._8_8_ = (uv_loop_t *)0x1c59d9;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    puVar1 = loop;
    auStack_30._8_8_ = SEXT48(iVar2);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5adc;
    auStack_30._8_8_ = (uv_loop_t *)0x4;
    auStack_30._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5ae9;
    auStack_30._8_8_ = SEXT48(close_cb_called);
    auStack_30._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_30._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5af6;
    auStack_30._8_8_ = (uv_loop_t *)0x1;
    auStack_30._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_30._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5b03;
    auStack_40._8_8_ = (uv_loop_t *)0x1c5a78;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_40._8_8_ = (uv_loop_t *)0x1c5a82;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_30._8_8_ = (uv_loop_t *)0x0;
    auStack_40._8_8_ = (uv_loop_t *)0x1c5a97;
    iVar2 = uv_loop_close(loop);
    auStack_30._0_8_ = SEXT48(iVar2);
    unaff_RBX = puVar1;
    if (auStack_30._8_8_ == auStack_30._0_8_) {
      auStack_40._8_8_ = (uv_loop_t *)0x1c5aad;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._8_8_ = (uv_loop_t *)0x1c5ac2;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c5ac2:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5acf;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c5acf:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5adc;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c5adc:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5ae9;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c5ae9:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5af6;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c5af6:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5b03;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c5b03:
    auStack_40._8_8_ = (uv_loop_t *)0x1c5b10;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  auStack_40._8_8_ = run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&pvStack_48;
  auStack_40._8_8_ = unaff_RBX;
  loop = uv_default_loop();
  start_server(loop,handle_00);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(loop,handle_00);
  auStack_40._0_8_ = SEXT48(write_cb_called);
  pvStack_48 = (void *)0x0;
  if ((void *)auStack_40._0_8_ == (void *)0x0) {
    auStack_40._0_8_ = SEXT48(close_cb_called);
    pvStack_48 = (void *)0x0;
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_001c5cb3;
    auStack_40._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_48 = (void *)0x0;
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_001c5cc0;
    iVar3 = uv_run(loop,UV_RUN_DEFAULT);
    puVar1 = loop;
    auStack_40._0_8_ = SEXT48(iVar3);
    pvStack_48 = (void *)0x0;
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_001c5ccd;
    auStack_40._0_8_ = (void *)0x4;
    pvStack_48 = (void *)(long)write_cb_called;
    if (pvStack_48 != (void *)0x4) goto LAB_001c5cda;
    auStack_40._0_8_ = (void *)0x1;
    pvStack_48 = (void *)(long)close_cb_called;
    if (pvStack_48 != (void *)0x1) goto LAB_001c5ce7;
    auStack_40._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_48 = (void *)0x0;
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_001c5cf4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_40._0_8_ = (void *)0x0;
    iVar3 = uv_loop_close(loop);
    pvStack_48 = (void *)(long)iVar3;
    if ((void *)auStack_40._0_8_ == pvStack_48) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c5cb3:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c5cc0:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c5ccd:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c5cda:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c5ce7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c5cf4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)auStack_40;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_001c5dc0;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c5dc0:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x399040;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}